

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

TValue * luaH_getint(Table *t,lua_Integer key)

{
  Node *pNVar1;
  long lVar2;
  
  if (key - 1U < (ulong)t->sizearray) {
    pNVar1 = (Node *)(t->array + (key - 1U));
  }
  else {
    pNVar1 = t->node + ((uint)key & ~(-1 << (t->lsizenode & 0x1f)));
    while (((pNVar1->i_key).nk.tt_ != 0x13 || ((pNVar1->i_key).nk.value_.gc != (GCObject *)key))) {
      lVar2 = (long)(pNVar1->i_key).nk.next;
      pNVar1 = pNVar1 + lVar2;
      if (lVar2 == 0) {
        return &luaO_nilobject_;
      }
    }
  }
  return &pNVar1->i_val;
}

Assistant:

const TValue *luaH_getint (Table *t, lua_Integer key) {
  /* (1 <= key && key <= t->sizearray) */
  if (l_castS2U(key) - 1 < t->sizearray)
    return &t->array[key - 1];
  else {
    Node *n = hashint(t, key);
    for (;;) {  /* check whether 'key' is somewhere in the chain */
      if (ttisinteger(gkey(n)) && ivalue(gkey(n)) == key)
        return gval(n);  /* that's it */
      else {
        int nx = gnext(n);
        if (nx == 0) break;
        n += nx;
      }
    }
    return luaO_nilobject;
  }
}